

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall
Parser::parseClass(Parser *this,Token *class_token,bool expect_class_name,bool is_local)

{
  pointer *ppEVar1;
  Token *pTVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Node *pNVar6;
  undefined3 in_register_00000009;
  NodeType NVar7;
  undefined4 in_register_0000000c;
  undefined7 in_register_00000011;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *psVar8;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *__addr_02;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  sockaddr *extraout_RDX_07;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  size_t i;
  ulong uVar9;
  long lVar10;
  Node *member;
  Node *memberValue;
  Node *memberName;
  NodeType local_6c;
  vector<Node_*,_std::allocator<Node_*>_> classMembers;
  Node *extends;
  Node *className;
  ExprContextScope exprContextScope;
  
  NVar7 = CONCAT31(in_register_00000009,is_local);
  parseClass(Token*,bool,bool)::ExprContextScope::ExprContextScope(std::vector<Parser::
  ExpressionContext,std::allocator<Parser::ExpressionContext>_>__
            (&exprContextScope,&this->expressionContext);
  className = (Node *)0x0;
  extends = (Node *)0x0;
  classMembers.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  classMembers.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  classMembers.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  psVar8 = extraout_RDX;
  if ((int)CONCAT71(in_register_00000011,expect_class_name) != 0) {
    className = parseDeref(this);
    psVar8 = extraout_RDX_00;
  }
  iVar4 = accept(this,0x55,psVar8,(socklen_t *)CONCAT44(in_register_0000000c,NVar7));
  if ((char)iVar4 != '\0') {
    extends = parseTernaryOp(this);
  }
  checkBraceIdentationStyle(this);
  expect(this,TK_LBRACE);
  psVar8 = extraout_RDX_01;
  local_6c = CONCAT31(in_register_00000009,is_local);
LAB_0010d968:
  do {
    do {
      if (this->ctx->isError != false) {
LAB_0010dc1b:
        pNVar6 = (Node *)operator_new(0x30);
        Node::Node(pNVar6,this->ctx,class_token);
        pNVar6->nodeType = local_6c & 0xff | PNT_CLASS;
        this_00 = &pNVar6->children;
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_00,&className);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_00,&extends);
        memberValue = (Node *)0x0;
        std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                  ((vector<Node*,std::allocator<Node*>> *)this_00,&memberValue);
        lVar10 = 0;
        for (uVar9 = 0;
            uVar9 < (ulong)((long)classMembers.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)classMembers.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1)
        {
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                    (this_00,(value_type *)
                             ((long)classMembers.super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar10));
          lVar10 = lVar10 + 8;
        }
        std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
                  (&classMembers.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
        ppEVar1 = &((exprContextScope.ec)->
                   super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + -1;
        return pNVar6;
      }
      iVar4 = accept(this,0x18,psVar8,(socklen_t *)CONCAT44(in_register_0000000c,NVar7));
      if ((char)iVar4 != '\0') goto LAB_0010dc1b;
      iVar4 = accept(this,0x33,__addr,(socklen_t *)CONCAT44(in_register_0000000c,NVar7));
      psVar8 = __addr_00;
    } while ((char)iVar4 != '\0');
    uVar5 = accept(this,0x5a,__addr_00,(socklen_t *)CONCAT44(in_register_0000000c,NVar7));
    psVar8 = __addr_01;
    if ((char)uVar5 == '\0') {
      iVar4 = accept(this,0x56,__addr_01,(socklen_t *)CONCAT44(in_register_0000000c,NVar7));
      psVar8 = extraout_RDX_02;
      if ((char)iVar4 != '\0') {
        pTVar2 = this->tok;
        memberValue = parseFunction(this,FT_CLASS_CONSTRUCTOR);
        memberName = (Node *)0x0;
        pNVar6 = (Node *)operator_new(0x30);
        Node::Node(pNVar6,this->ctx,pTVar2);
        pNVar6->nodeType = PNT_CLASS_MEMBER;
        member = pNVar6;
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&pNVar6->children,&memberName);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&member->children,&memberValue);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&classMembers,&member);
        psVar8 = extraout_RDX_03;
        goto LAB_0010d968;
      }
    }
    iVar4 = accept(this,0x48,psVar8,(socklen_t *)CONCAT44(in_register_0000000c,NVar7));
    uVar5 = uVar5 & 0xff;
    if ((char)iVar4 == '\0') {
      iVar4 = accept(this,0x19,__addr_02,(socklen_t *)CONCAT44(in_register_0000000c,NVar7));
      if ((char)iVar4 == '\0') {
        bVar3 = expect(this,TK_IDENTIFIER);
        psVar8 = extraout_RDX_05;
        if (bVar3) {
          memberValue = createIdentifierNode(this,this->tok);
          expect(this,TK_ASSIGN);
          pTVar2 = this->tok;
          memberName = parseTernaryOp(this);
          pNVar6 = (Node *)operator_new(0x30);
          Node::Node(pNVar6,this->ctx,pTVar2);
          pNVar6->nodeType = uVar5 + PNT_CLASS_MEMBER;
          member = pNVar6;
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&pNVar6->children,&memberValue);
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&member->children,&memberName);
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&classMembers,&member);
          psVar8 = extraout_RDX_06;
        }
      }
      else {
        pTVar2 = this->tok;
        pNVar6 = parseTernaryOp(this);
        memberValue = createMakeKeyNode(this,pTVar2,pNVar6);
        expect(this,TK_RSQUARE);
        expect(this,TK_ASSIGN);
        pTVar2 = this->tok;
        memberName = parseTernaryOp(this);
        pNVar6 = (Node *)operator_new(0x30);
        Node::Node(pNVar6,this->ctx,pTVar2);
        pNVar6->nodeType = uVar5 + PNT_CLASS_MEMBER;
        member = pNVar6;
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&pNVar6->children,&memberValue);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&member->children,&memberName);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&classMembers,&member);
        psVar8 = extraout_RDX_04;
      }
    }
    else {
      pTVar2 = this->tok;
      memberValue = parseFunction(this,FT_CLASS_METHOD);
      if (memberValue == (Node *)0x0) {
        memberName = (Node *)0x0;
      }
      else {
        memberName = *(memberValue->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      }
      pNVar6 = (Node *)operator_new(0x30);
      Node::Node(pNVar6,this->ctx,pTVar2);
      pNVar6->nodeType = uVar5 + PNT_CLASS_MEMBER;
      member = pNVar6;
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&pNVar6->children,&memberName);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&member->children,&memberValue);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&classMembers,&member);
      psVar8 = extraout_RDX_07;
    }
  } while( true );
}

Assistant:

Node * parseClass(Token * class_token, bool expect_class_name, bool is_local)
  {
    EXPRESSION_CONTEXT_SCOPE(EC_USUAL);

    Node * className = nullptr;
    Node * extends = nullptr;
    vector<Node *> classMembers;
    if (expect_class_name)
      className = parseDeref();

    if (accept(TK_EXTENDS))
      extends = parseTernaryOp();

    checkBraceIdentationStyle();
    expect(TK_LBRACE);

    while (!ctx.isError)
    {
      if (accept(TK_RBRACE))
        break;

      if (accept(TK_SEMICOLON))
        continue;

      bool isStatic = accept(TK_STATIC);

      if (!isStatic && accept(TK_CONSTRUCTOR))
      {
        Token * memberTok = tok;
        Node * memberValue = parseFunction(FT_CLASS_CONSTRUCTOR);
        Node * memberName = nullptr;

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (accept(TK_FUNCTION))
      {
        Token * memberTok = tok;
        Node * memberValue = parseFunction(FT_CLASS_METHOD);
        Node * memberName = memberValue ? memberValue->children[0] : nullptr;

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (accept(TK_LSQUARE))
      {
        Node * memberName = createMakeKeyNode(*tok, parseTernaryOp());
        expect(TK_RSQUARE);
        expect(TK_ASSIGN);
        Token * memberTok = tok;
        Node * memberValue = parseTernaryOp();

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (expect(TK_IDENTIFIER))
      {
        Node * memberName = createIdentifierNode(*tok);
        expect(TK_ASSIGN);
        Token * memberTok = tok;
        Node * memberValue = parseTernaryOp();

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
    }

    Node * res = new Node(ctx, *class_token);
    res->nodeType = is_local ? PNT_LOCAL_CLASS : PNT_CLASS;
    res->children.push_back(className);
    res->children.push_back(extends);
    res->children.push_back(nullptr); // attributes (removed code)
    for (size_t i = 0; i < classMembers.size(); i++)
      res->children.push_back(classMembers[i]);
    return res;
  }